

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O1

void __thiscall txpackage_tests::package_rbf_tests::test_method(package_rbf_tests *this)

{
  size_type *this_00;
  undefined1 auVar1 [16];
  long lVar2;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  ushort uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  CKey input_signing_key;
  CKey input_signing_key_00;
  CKey input_signing_key_01;
  CKey input_signing_key_02;
  CKey input_signing_key_03;
  CKey input_signing_key_04;
  CKey input_signing_key_05;
  CKey input_signing_key_06;
  CKey input_signing_key_07;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  element_type *peVar21;
  undefined1 uVar22;
  undefined7 uVar23;
  bool bVar24;
  Chainstate *pCVar25;
  const_iterator cVar26;
  const_iterator cVar27;
  int64_t iVar28;
  _Base_ptr p_Var29;
  pointer *ppCVar30;
  long lVar31;
  uint32_t num_bytes;
  CTxMemPool *pCVar32;
  iterator pvVar33;
  PackageMempoolAcceptResult *pPVar34;
  iterator pvVar35;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *poVar36;
  CMutableTransaction *client_maxfeerate;
  long in_FS_OFFSET;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_01;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  initializer_list<transaction_identifier<true>_> __l_02;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  CTransactionRef input_transaction;
  CTransactionRef input_transaction_00;
  CTransactionRef input_transaction_01;
  CTransactionRef input_transaction_02;
  CTransactionRef input_transaction_03;
  CTransactionRef input_transaction_04;
  CTransactionRef input_transaction_05;
  CTransactionRef input_transaction_06;
  CTransactionRef input_transaction_07;
  undefined4 uVar49;
  check_type cVar55;
  undefined8 uVar50;
  undefined8 in_stack_fffffffffffff5c8;
  TestChain100Setup *pTVar51;
  TestChain100Setup *pTVar52;
  int iVar53;
  undefined8 in_stack_fffffffffffff5d0;
  CKey *other;
  CKey *pCVar54;
  CAmount in_stack_fffffffffffff5d8;
  undefined1 in_stack_fffffffffffff5e0;
  char *local_a18;
  char *local_a10;
  undefined1 *local_a08;
  undefined1 *local_a00;
  char *local_9f8;
  char *local_9f0;
  undefined1 local_9e4 [12];
  undefined1 *local_9d8;
  undefined1 *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8 [2];
  undefined1 *local_9a8;
  undefined1 *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  undefined1 *local_978;
  undefined1 *local_970;
  char *local_968;
  char *local_960;
  CTransactionRef tx_parent;
  undefined8 local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  undefined1 *local_870;
  undefined1 *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  Package package3;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  undefined1 local_708 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_700;
  element_type *local_6f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6f0;
  CTransactionRef tx_child_3;
  undefined1 local_6d8 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_6d0;
  element_type *local_6c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6c0;
  CTransactionRef tx_parent_3;
  undefined1 local_6a8 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_6a0;
  element_type *local_698;
  pointer local_690;
  CTransactionRef tx_child_2_1;
  undefined1 local_678 [16];
  element_type *local_668;
  pointer local_660;
  CTransactionRef tx_parent_2;
  undefined1 local_648 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_640;
  element_type *local_638;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_630;
  undefined1 local_628 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_620;
  element_type *local_618;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_610;
  char *local_608;
  char *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  assertion_result local_598;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 local_498 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_490;
  element_type *local_488;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_480;
  CTransactionRef tx_child_2;
  undefined1 local_468 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_460;
  element_type *local_458;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_450;
  undefined1 local_448 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_440;
  element_type *local_438;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_430;
  Package package2;
  Package package1;
  CKey grandchild_key;
  CKey child_key;
  size_t expected_pool_size;
  undefined1 local_3c0 [8];
  undefined1 local_3b8 [16];
  shared_count sStack_3a8;
  undefined1 local_3a0 [8];
  undefined1 local_398 [8];
  CTransactionRef tx_child_1;
  undefined1 local_380 [8];
  undefined1 local_378 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err_2;
  CMutableTransaction mtx_parent;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0 [3];
  direct_or_indirect local_290;
  uint local_274;
  direct_or_indirect local_270;
  uint local_254;
  direct_or_indirect local_250;
  uint local_234;
  direct_or_indirect local_230;
  uint local_214;
  direct_or_indirect local_210;
  uint local_1f4;
  direct_or_indirect local_1f0;
  uint local_1d4;
  PackageMempoolAcceptResult submit2;
  PackageMempoolAcceptResult submit1;
  direct_or_indirect local_d8;
  uint local_bc;
  direct_or_indirect local_b8;
  uint local_9c;
  direct_or_indirect local_98;
  uint local_7c;
  CScript child_spk;
  CScript parent_spk;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  TestChain100Setup::mineBlocks((TestChain100Setup *)this,5);
  criticalblock23.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock23.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock23.super_unique_lock);
  expected_pool_size =
       CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                        super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                        mempool._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  GenerateRandomKey(SUB81(&child_key,0));
  CKey::GetPubKey((CPubKey *)&submit2,&child_key);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&mtx_parent,(CPubKey *)&submit2);
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       CONCAT44(submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                _M_string_length._4_4_,
                mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  submit1.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  submit1.m_tx_results._M_t._M_impl._0_1_ = 5;
  GetScriptForDestination(&parent_spk,(CTxDestination *)&submit1);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&submit1);
  GenerateRandomKey(SUB81(&grandchild_key,0));
  CKey::GetPubKey((CPubKey *)&submit2,&grandchild_key);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&mtx_parent,(CPubKey *)&submit2);
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       CONCAT44(submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                _M_string_length._4_4_,
                mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_);
  submit1.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
  submit1.m_tx_results._M_t._M_impl._0_1_ = 5;
  GetScriptForDestination(&child_spk,(CTxDestination *)&submit1);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&submit1);
  package1.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  package1.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package1.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  package2.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  package2.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  package2.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_438 = (psVar3->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_430 = (psVar3->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_430 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_430->_M_use_count = local_430->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_430->_M_use_count = local_430->_M_use_count + 1;
    }
  }
  other = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.coinbaseKey;
  CKey::CKey((CKey *)local_448,other);
  uVar50 = 0x6a8fbe;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_98.indirect_contents,
             &parent_spk.super_CScriptBase);
  input_signing_key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05f138;
  input_signing_key._0_8_ = &local_98;
  auVar12._8_8_ = in_stack_fffffffffffff5c8;
  auVar12._0_8_ = uVar50;
  auVar12._16_8_ = in_stack_fffffffffffff5d0;
  auVar12._24_8_ = 0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_438;
  TestChain100Setup::CreateValidMempoolTransaction
            (&mtx_parent,(TestChain100Setup *)this,input_transaction,0,(int)local_448,
             input_signing_key,(CScript)(auVar12 << 0x40),in_stack_fffffffffffff5d8,
             (bool)in_stack_fffffffffffff5e0);
  if (0x1c < local_7c) {
    free(local_98.indirect_contents.indirect);
    local_98.indirect_contents.indirect = (char *)0x0;
  }
  if (local_440._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_440,
               local_440._M_head_impl);
  }
  local_440._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_430 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_430);
  }
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_parent,(allocator<CTransaction> *)&submit1,
             &mtx_parent);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package1,&tx_parent);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package2,&tx_parent);
  local_458 = tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_450 = tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_468,&child_key);
  uVar50 = 0x6a9112;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents,
             &child_spk.super_CScriptBase);
  input_signing_key_00.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05f00c;
  input_signing_key_00._0_8_ = &local_b8;
  auVar13._8_8_ = in_stack_fffffffffffff5c8;
  auVar13._0_8_ = uVar50;
  auVar13._16_8_ = in_stack_fffffffffffff5d0;
  auVar13._24_8_ = 0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_458;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)&submit1,(TestChain100Setup *)this,input_transaction_00,0x65,
             (int)local_468,input_signing_key_00,(CScript)(auVar13 << 0x40),
             in_stack_fffffffffffff5d8,(bool)in_stack_fffffffffffff5e0);
  tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            (&tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_child_1,(allocator<CTransaction> *)&submit2,
             (CMutableTransaction *)&submit1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             &submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
            );
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&submit1);
  if (0x1c < local_9c) {
    free(local_b8.indirect_contents.indirect);
    local_b8.indirect_contents.indirect = (char *)0x0;
  }
  if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_460._M_head_impl != (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_460,
               local_460._M_head_impl);
  }
  local_460._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_450 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package1,&tx_child_1);
  local_488 = tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_480 = tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_498,&child_key);
  uVar50 = 0x6a926e;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_d8.indirect_contents,
             &child_spk.super_CScriptBase);
  input_signing_key_01.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05ef44;
  input_signing_key_01._0_8_ = &local_d8;
  auVar14._8_8_ = in_stack_fffffffffffff5c8;
  auVar14._0_8_ = uVar50;
  auVar14._16_8_ = in_stack_fffffffffffff5d0;
  auVar14._24_8_ = 0;
  input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_01.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_488;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)&submit1,(TestChain100Setup *)this,input_transaction_01,0x65,
             (int)local_498,input_signing_key_01,(CScript)(auVar14 << 0x40),
             in_stack_fffffffffffff5d8,(bool)in_stack_fffffffffffff5e0);
  tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            (&tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_child_2,(allocator<CTransaction> *)&submit2,
             (CMutableTransaction *)&submit1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             &submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
            );
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&submit1);
  if (0x1c < local_bc) {
    free(local_d8.indirect_contents.indirect);
    local_d8.indirect_contents.indirect = (char *)0x0;
  }
  if (local_490._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_490,
               local_490._M_head_impl);
  }
  local_490._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_480 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_480);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::push_back(&package2,&tx_child_2);
  criticalblock24.super_unique_lock._M_device =
       &(((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
          super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
          super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
          super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
          super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl)->cs).super_recursive_mutex;
  criticalblock24.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock24.super_unique_lock);
  pCVar25 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pPVar34 = &submit2;
  auVar1[0xf] = 0;
  auVar1._0_15_ =
       (undefined1  [15])
       submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._1_15_;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._0_16_ =
       auVar1 << 8;
  ProcessNewPackage(&submit1,pCVar25,
                    (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package1,false,
                    (optional<CFeeRate> *)pPVar34);
  pCVar32 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestChain100Setup.super_TestingSetup.
            super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&submit2,&package1,&submit1,true,pCVar32);
  if (submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_local_buf[8] == '\x01') {
    local_4a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_4a0 = "";
    local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar55 = 0x6a9433;
    file.m_end = (iterator)0x3d0;
    file.m_begin = (iterator)&local_4a8;
    msg.m_end = (iterator)pPVar34;
    msg.m_begin = (iterator)pCVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_4b8,msg);
    local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
    local_3b8._8_8_ = (element_type *)0x0;
    sStack_3a8.pi_ = (sp_counted_base *)0x0;
    if (submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_local_buf[8] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
      goto LAB_006ad61b;
    }
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length._0_1_ = 0;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._0_1_ = 0x30;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._1_7_ = 0x13aba;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_1_ = 0x38;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._17_7_ = 0x13c01;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_1_ = SUB81(&submit2,0);
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._25_7_ = (undefined7)((ulong)&submit2 >> 8);
    local_4c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_4c0 = "";
    pCVar32 = (CTxMemPool *)0x1;
    pPVar34 = (PackageMempoolAcceptResult *)0x1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_3b8,(lazy_ostream *)&err_2,1,1,WARN,_cVar55,
               (size_t)&local_4c8,0x3d0);
    boost::detail::shared_count::~shared_count((shared_count *)(local_3b8 + 0x10));
  }
  if ((submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
       _M_local_buf[8] == '\x01') &&
     (submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_local_buf[8] = '\0',
     (size_type *)submit2.m_state.super_ValidationState<PackageValidationResult>._0_8_ !=
     &submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
      _M_string_length)) {
    operator_delete((void *)submit2.m_state.super_ValidationState<PackageValidationResult>._0_8_,
                    submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    _M_string_length + 1);
  }
  cVar26 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find(&submit1.m_tx_results._M_t,
                  &((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped);
  cVar27 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find(&submit1.m_tx_results._M_t,
                  &((tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped);
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x3d6;
  file_00.m_begin = (iterator)&local_4d8;
  msg_00.m_end = (iterator)pPVar34;
  msg_00.m_begin = (iterator)pCVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_4e8,
             msg_00);
  local_3b8._8_8_ = local_3b8._9_8_ << 8;
  local_3b8._0_8_ = &PTR__lazy_ostream_013abb30;
  sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = (undefined1  [8])0xf6cf21;
  package3.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(cVar26._M_node + 2);
  tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&tx_child_2_1;
  tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((ulong)tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr._4_4_ << 0x20);
  local_598.m_message.px = (element_type *)0x0;
  local_598.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_380 = (undefined1  [8])0xf658c7;
  local_378._0_8_ = "";
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)(submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _1_8_ << 8);
  submit2.m_state.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013b0e70
  ;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13b0e;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = SUB81(&tx_parent_2,0);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)&tx_parent_2 >> 8);
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  uVar49 = SUB84(&err_2,0);
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&package3;
  local_598.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(cVar26._M_node[2]._M_color == _S_red);
  boost::test_tools::tt_detail::report_assertion
            (&local_598,(lazy_ostream *)local_3b8,1,2,REQUIRE,0xf67f6c,(size_t)local_380,0x3d6,
             &submit2,"MempoolAcceptResult::ResultType::VALID",uVar49);
  boost::detail::shared_count::~shared_count(&local_598.m_message.pn);
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x3d7;
  file_01.m_begin = (iterator)&local_4f8;
  msg_01.m_end = pvVar35;
  msg_01.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_508,
             msg_01);
  local_3b8._8_8_ = local_3b8._9_8_ << 8;
  local_3b8._0_8_ = &PTR__lazy_ostream_013abb30;
  sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = (undefined1  [8])0xf6cf21;
  package3.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(cVar27._M_node + 2);
  tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((ulong)tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr & 0xffffffff00000000);
  local_598.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar27._M_node[2]._M_color == _S_red);
  local_598.m_message.px = (element_type *)0x0;
  local_598.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_380 = (undefined1  [8])0xf658c7;
  local_378._0_8_ = "";
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)(submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _1_8_ << 8);
  submit2.m_state.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013b0e70
  ;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&tx_child_2_1;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13b0e;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = SUB81(&tx_parent_2,0);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)&tx_parent_2 >> 8);
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&package3;
  boost::test_tools::tt_detail::report_assertion
            (&local_598,(lazy_ostream *)local_3b8,1,2,REQUIRE,0xf67f8e,(size_t)local_380,0x3d7,
             &submit2,"MempoolAcceptResult::ResultType::VALID",uVar49);
  boost::detail::shared_count::~shared_count(&local_598.m_message.pn);
  expected_pool_size = expected_pool_size + 2;
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x3d9;
  file_02.m_begin = (iterator)&local_518;
  msg_02.m_end = pvVar35;
  msg_02.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_528,
             msg_02);
  local_3b8._8_8_ = local_3b8._9_8_ << 8;
  local_3b8._0_8_ = &PTR__lazy_ostream_013abb30;
  sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = (undefined1  [8])0xf6cf21;
  tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CTxMemPool::size((((BOOST_AUTO_TEST_CASE_FIXTURE *)
                         &((TestChain100Setup *)this)->super_TestingSetup)->super_TestChain100Setup)
                        .super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                        mempool._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&expected_pool_size;
  local_598.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)expected_pool_size);
  local_598.m_message.px = (element_type *)0x0;
  local_598.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_380 = (undefined1  [8])0xf658c7;
  local_378._0_8_ = (element_type *)0xf6592f;
  package3.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = &tx_child_2_1;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)(submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _1_8_ << 8);
  submit2.m_state.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013abb70
  ;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13abb;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = SUB81(&tx_parent_2,0);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)&tx_parent_2 >> 8);
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&package3;
  boost::test_tools::tt_detail::report_assertion
            (&local_598,(lazy_ostream *)local_3b8,1,2,REQUIRE,0xf66425,(size_t)local_380,0x3d9,
             &submit2,"expected_pool_size",uVar49);
  boost::detail::shared_count::~shared_count(&local_598.m_message.pn);
  pTVar51 = (TestChain100Setup *)this;
  pCVar25 = ChainstateManager::ActiveChainstate
                      ((((BOOST_AUTO_TEST_CASE_FIXTURE *)
                        &((TestChain100Setup *)this)->super_TestingSetup)->super_TestChain100Setup).
                       super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                       chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  poVar36 = &err_2;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  ProcessNewPackage(&submit2,pCVar25,
                    (((BOOST_AUTO_TEST_CASE_FIXTURE *)
                     &((TestChain100Setup *)this)->super_TestingSetup)->super_TestChain100Setup).
                    super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                    mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                    ._M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package2,false,
                    (optional<CFeeRate> *)poVar36);
  pCVar32 = (((BOOST_AUTO_TEST_CASE_FIXTURE *)&((TestChain100Setup *)this)->super_TestingSetup)->
            super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node.mempool._M_t.
            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_(&err_2,&package2,&submit2,true,pCVar32);
  if (err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_538 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_530 = "";
    local_548 = &boost::unit_test::basic_cstring<char_const>::null;
    local_540 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar55 = 0x6a99e8;
    file_03.m_end = (iterator)0x3dd;
    file_03.m_begin = (iterator)&local_538;
    msg_03.m_end = (iterator)poVar36;
    msg_03.m_begin = (iterator)pCVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_548,
               msg_03);
    local_598._0_8_ = local_598._0_8_ & 0xffffffffffffff00;
    local_598.m_message.px = (element_type *)0x0;
    local_598.m_message.pn.pi_ = (sp_counted_base *)0x0;
    if (err_2.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
      goto LAB_006ad61b;
    }
    local_3b8._8_8_ = local_3b8._9_8_ << 8;
    local_3b8._0_8_ = &PTR__lazy_ostream_013aba30;
    sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_558 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_550 = "";
    pCVar32 = (CTxMemPool *)0x1;
    poVar36 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x1;
    local_3a0 = (undefined1  [8])&err_2;
    boost::test_tools::tt_detail::report_assertion
              (&local_598,(lazy_ostream *)local_3b8,1,1,WARN,_cVar55,(size_t)&local_558,0x3dd);
    boost::detail::shared_count::~shared_count(&local_598.m_message.pn);
  }
  if (err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    if ((void *)CONCAT71(err_2.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._1_7_,
                         err_2.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._0_1_) !=
        (void *)((long)&err_2.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 0x10)) {
      operator_delete((void *)CONCAT71(err_2.
                                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ._M_payload._1_7_,
                                       err_2.
                                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ._M_payload._0_1_),
                      CONCAT71(err_2.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload._17_7_,
                               err_2.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload._16_1_) + 1);
    }
  }
  cVar26 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find(&submit2.m_tx_results._M_t,
                  &((tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped);
  cVar27 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find(&submit2.m_tx_results._M_t,
                  &((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped);
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x3e3;
  file_04.m_begin = (iterator)&local_568;
  msg_04.m_end = (iterator)poVar36;
  msg_04.m_begin = (iterator)pCVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_578,
             msg_04);
  local_598.m_message.px = (element_type *)(local_598.m_message._1_8_ << 8);
  local_598._0_8_ = &PTR__lazy_ostream_013abb30;
  local_598.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_580 = "";
  tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(cVar26._M_node + 2);
  tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,2);
  local_378._0_8_ = (element_type *)0x0;
  local_378._8_8_ = (sp_counted_base *)0x0;
  package3.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_19fcf61;
  package3.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6592f;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13b0e;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = SUB81(&tx_parent_2,0);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)&tx_parent_2 >> 8);
  local_3b8._8_8_ = local_3b8._9_8_ << 8;
  local_3b8._0_8_ = &PTR__lazy_ostream_013b0e70;
  sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = (undefined1  [8])&tx_child_2_1;
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&tx_parent_3;
  local_380[0] = cVar26._M_node[2]._M_color == 2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_380,(lazy_ostream *)&local_598,1,2,REQUIRE,0xf67faf,
             (size_t)&package3,0x3e3,(pointer)&err_2,
             "MempoolAcceptResult::ResultType::MEMPOOL_ENTRY",(int)local_3b8);
  boost::detail::shared_count::~shared_count((shared_count *)(local_380 + 0x10));
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x3e4;
  file_05.m_begin = (iterator)&local_5a8;
  msg_05.m_end = pvVar35;
  msg_05.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_5b8,
             msg_05);
  local_598.m_message.px = (element_type *)(local_598.m_message._1_8_ << 8);
  local_598._0_8_ = &PTR__lazy_ostream_013abb30;
  local_598.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_580 = "";
  tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(cVar27._M_node + 2);
  tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((ulong)tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       & 0xffffffff00000000);
  local_380[0] = cVar27._M_node[2]._M_color == _S_red;
  local_378._0_8_ = (element_type *)0x0;
  local_378._8_8_ = (sp_counted_base *)0x0;
  package3.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_19fcf61;
  package3.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6592f;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13b0e;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = SUB81(&tx_parent_2,0);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)&tx_parent_2 >> 8);
  local_3b8._8_8_ = local_3b8._9_8_ << 8;
  local_3b8._0_8_ = &PTR__lazy_ostream_013b0e70;
  sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = (undefined1  [8])&tx_child_2_1;
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&tx_parent_3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_380,(lazy_ostream *)&local_598,1,2,REQUIRE,0xf67fd1,
             (size_t)&package3,0x3e4,(pointer)&err_2,"MempoolAcceptResult::ResultType::VALID",
             (int)local_3b8);
  boost::detail::shared_count::~shared_count((shared_count *)(local_380 + 0x10));
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x3e5;
  file_06.m_begin = (iterator)&local_5c8;
  msg_06.m_end = pvVar35;
  msg_06.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_5d8,
             msg_06);
  local_598.m_message.px = (element_type *)(local_598.m_message._1_8_ << 8);
  local_598._0_8_ = &PTR__lazy_ostream_013abb30;
  local_598.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_580 = "";
  tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CTxMemPool::size((((BOOST_AUTO_TEST_CASE_FIXTURE *)&pTVar51->super_TestingSetup)->
                        super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  local_380[0] = tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr == (element_type *)expected_pool_size;
  local_378._0_8_ = (element_type *)0x0;
  local_378._8_8_ = (sp_counted_base *)0x0;
  package3.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_19fcf61;
  package3.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6592f;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13abb;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = SUB81(&tx_parent_2,0);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)&tx_parent_2 >> 8);
  tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&expected_pool_size;
  local_3b8._8_8_ = local_3b8._9_8_ << 8;
  local_3b8._0_8_ = &PTR__lazy_ostream_013abb70;
  sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = (undefined1  [8])&tx_child_2_1;
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&tx_parent_3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_380,(lazy_ostream *)&local_598,1,2,REQUIRE,0xf66425,
             (size_t)&package3,0x3e5,(pointer)&err_2,"expected_pool_size",(int)local_3b8);
  boost::detail::shared_count::~shared_count((shared_count *)(local_380 + 0x10));
  local_5e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_5e0 = "";
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x3e8;
  file_07.m_begin = (iterator)&local_5e8;
  msg_07.m_end = pvVar35;
  msg_07.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_5f8,
             msg_07);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0;
  uVar50 = *(undefined8 *)
            ((tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar8 = *(undefined8 *)
           (((tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar9 = *(undefined8 *)
           (((tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar10 = *(undefined8 *)
            (((tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = (undefined7)uVar50;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = (undefined1)((ulong)uVar50 >> 0x38);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._1_7_ = (undefined7)uVar8;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = (undefined1)((ulong)uVar8 >> 0x38);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = (undefined7)uVar9;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = (undefined1)((ulong)uVar9 >> 0x38);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)uVar10;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = SUB81((ulong)uVar10 >> 0x38,0);
  _cVar55 = 0x6a9f76;
  pTVar52 = pTVar51;
  bVar24 = CTxMemPool::exists((pTVar51->super_TestingSetup).super_ChainTestingSetup.
                              super_BasicTestingSetup.m_node.mempool._M_t.
                              super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                              .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,
                              (GenTxid *)&err_2);
  local_598.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar24;
  local_598.m_message.px = (element_type *)0x0;
  local_598.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_380 = (undefined1  [8])0xf67ff2;
  local_378._0_8_ = (element_type *)0xf6802f;
  local_3b8._8_8_ = local_3b8._9_8_ << 8;
  local_3b8._0_8_ = &PTR__lazy_ostream_013abc70;
  sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = (undefined1  [8])local_380;
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_600 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_598,(lazy_ostream *)local_3b8,1,0,WARN,_cVar55,(size_t)&local_608,1000);
  pCVar54 = other;
  boost::detail::shared_count::~shared_count(&local_598.m_message.pn);
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree(&submit2.m_tx_results._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)submit2.m_state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
         _M_p !=
      &submit2.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2) {
    operator_delete(submit2.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                    _M_dataplus._M_p,
                    submit2.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                    field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
         _M_p !=
      &submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2) {
    operator_delete(submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    _M_dataplus._M_p,
                    submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  ::~_Rb_tree(&submit1.m_tx_results._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)submit1.m_state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
         _M_p !=
      &submit1.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2) {
    operator_delete(submit1.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                    _M_dataplus._M_p,
                    submit1.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                    field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
         _M_p !=
      &submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2) {
    operator_delete(submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    _M_dataplus._M_p,
                    submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    field_2._M_allocated_capacity + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock24.super_unique_lock);
  if (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx_parent.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx_parent.vin);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package2);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&package1);
  psVar3 = (pTVar51->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_618 = psVar3[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_610 = psVar3[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_610 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_610->_M_use_count = local_610->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_610->_M_use_count = local_610->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_628,other);
  uVar50 = 0x6aa19f;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_1f0.indirect_contents,
             &parent_spk.super_CScriptBase);
  input_signing_key_02.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05f138;
  input_signing_key_02._0_8_ = &local_1f0;
  auVar15._8_8_ = pTVar52;
  auVar15._0_8_ = uVar50;
  auVar15._16_8_ = pCVar54;
  auVar15._24_8_ = 0;
  input_transaction_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_02.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_618;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)&submit1,pTVar51,input_transaction_02,0,(int)local_628,
             input_signing_key_02,(CScript)(auVar15 << 0x40),in_stack_fffffffffffff5d8,
             (bool)in_stack_fffffffffffff5e0);
  tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            (&tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_child_2,(allocator<CTransaction> *)&submit2,
             (CMutableTransaction *)&submit1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             &submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
            );
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&submit1);
  if (0x1c < local_1d4) {
    free(local_1f0.indirect_contents.indirect);
    local_1f0.indirect_contents.indirect = (char *)0x0;
  }
  if (local_620._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_620,
               local_620._M_head_impl);
  }
  local_620._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_610 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_610);
  }
  local_638 = tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_630 = tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_648,&child_key);
  uVar50 = 0x6aa2e3;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_210.indirect_contents,
             &child_spk.super_CScriptBase);
  input_signing_key_03.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05f070;
  input_signing_key_03._0_8_ = &local_210;
  auVar16._8_8_ = pTVar52;
  auVar16._0_8_ = uVar50;
  auVar16._16_8_ = pCVar54;
  auVar16._24_8_ = 0;
  input_transaction_03.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_03.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_638;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)&submit1,pTVar51,input_transaction_03,0x65,(int)local_648,
             input_signing_key_03,(CScript)(auVar16 << 0x40),in_stack_fffffffffffff5d8,
             (bool)in_stack_fffffffffffff5e0);
  criticalblock24.super_unique_lock._M_device = (mutex_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &criticalblock24.super_unique_lock._M_owns,(CTransaction **)&criticalblock24,
             (allocator<CTransaction> *)&submit2,(CMutableTransaction *)&submit1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             &submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
            );
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&submit1);
  if (0x1c < local_1f4) {
    free(local_210.indirect_contents.indirect);
    local_210.indirect_contents.indirect = (char *)0x0;
  }
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_640._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_640,
               local_640._M_head_impl);
  }
  local_640._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_630 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_630);
  }
  psVar3 = (pTVar51->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_668 = psVar3[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_660 = (pointer)psVar3[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
  if (local_660 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_660->scriptPubKey).super_CScriptBase._union =
           *(int *)&(local_660->scriptPubKey).super_CScriptBase._union + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_660->scriptPubKey).super_CScriptBase._union =
           *(int *)&(local_660->scriptPubKey).super_CScriptBase._union + 1;
    }
  }
  CKey::CKey((CKey *)local_678,other);
  uVar50 = 0x6aa425;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_230.indirect_contents,
             &parent_spk.super_CScriptBase);
  input_signing_key_04.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05eee0;
  input_signing_key_04._0_8_ = &local_230;
  auVar17._8_8_ = pTVar52;
  auVar17._0_8_ = uVar50;
  auVar17._16_8_ = pCVar54;
  auVar17._24_8_ = 0;
  input_transaction_04.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_04.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_668;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)&submit1,pTVar51,input_transaction_04,0,(int)local_678,
             input_signing_key_04,(CScript)(auVar17 << 0x40),in_stack_fffffffffffff5d8,
             (bool)in_stack_fffffffffffff5e0);
  tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            (&tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_parent_2,(allocator<CTransaction> *)&submit2,
             (CMutableTransaction *)&submit1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             &submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
            );
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&submit1);
  if (0x1c < local_214) {
    free(local_230.indirect_contents.indirect);
    local_230.indirect_contents.indirect = (char *)0x0;
  }
  if ((pointer)local_678._8_8_ != (pointer)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)(local_678 + 8),
               (array<unsigned_char,_32UL> *)local_678._8_8_);
  }
  local_678._8_8_ = (pointer)0x0;
  if (local_660 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_660);
  }
  local_698 = tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_690 = (pointer)tx_parent_2.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
  if (tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_6a8,&child_key);
  uVar50 = 0x6aa569;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_250.indirect_contents,
             &child_spk.super_CScriptBase);
  input_signing_key_05.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05ee18;
  input_signing_key_05._0_8_ = &local_250;
  auVar18._8_8_ = pTVar52;
  auVar18._0_8_ = uVar50;
  auVar18._16_8_ = pCVar54;
  auVar18._24_8_ = 0;
  input_transaction_05.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_05.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_698;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)&submit1,pTVar51,input_transaction_05,0x65,(int)local_6a8,
             input_signing_key_05,(CScript)(auVar18 << 0x40),in_stack_fffffffffffff5d8,
             (bool)in_stack_fffffffffffff5e0);
  tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            (&tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_child_2_1,(allocator<CTransaction> *)&submit2,
             (CMutableTransaction *)&submit1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             &submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
            );
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&submit1);
  if (0x1c < local_234) {
    free(local_250.indirect_contents.indirect);
    local_250.indirect_contents.indirect = (char *)0x0;
  }
  if ((_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)local_6a0._M_head_impl !=
      (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_6a0,
               local_6a0._M_head_impl);
  }
  local_6a0._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_690 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_690);
  }
  psVar3 = (pTVar51->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_6c8 = psVar3[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_6c0 = psVar3[1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_6c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_6c0->_M_use_count = local_6c0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_6c0->_M_use_count = local_6c0->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_6d8,other);
  uVar50 = 0x6aa6ab;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_270.indirect_contents,
             &parent_spk.super_CScriptBase);
  input_signing_key_06.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05f139;
  input_signing_key_06._0_8_ = &local_270;
  auVar19._8_8_ = pTVar52;
  auVar19._0_8_ = uVar50;
  auVar19._16_8_ = pCVar54;
  auVar19._24_8_ = 0;
  input_transaction_06.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_06.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_6c8;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)&submit1,pTVar51,input_transaction_06,0,(int)local_6d8,
             input_signing_key_06,(CScript)(auVar19 << 0x40),in_stack_fffffffffffff5d8,
             (bool)in_stack_fffffffffffff5e0);
  tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            (&tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_parent_3,(allocator<CTransaction> *)&submit2,
             (CMutableTransaction *)&submit1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             &submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
            );
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&submit1);
  if (0x1c < local_254) {
    free(local_270.indirect_contents.indirect);
    local_270.indirect_contents.indirect = (char *)0x0;
  }
  if ((tuple<std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_6d0._M_head_impl != (_Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_6d0,
               local_6d0._M_head_impl);
  }
  local_6d0._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_6c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6c0);
  }
  local_6f8 = tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_6f0 = tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CKey::CKey((CKey *)local_708,&child_key);
  uVar50 = 0x6aa7ef;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_290.indirect_contents,
             &child_spk.super_CScriptBase);
  pvVar33 = local_708;
  pvVar35 = (iterator)0x65;
  input_signing_key_07.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )0x12a05ec25;
  input_signing_key_07._0_8_ = &local_290;
  auVar20._8_8_ = pTVar52;
  auVar20._0_8_ = uVar50;
  auVar20._16_8_ = pCVar54;
  auVar20._24_8_ = 0;
  input_transaction_07.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  input_transaction_07.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_6f8;
  TestChain100Setup::CreateValidMempoolTransaction
            ((CMutableTransaction *)&submit1,pTVar51,input_transaction_07,0x65,(int)pvVar33,
             input_signing_key_07,(CScript)(auVar20 << 0x40),in_stack_fffffffffffff5d8,
             (bool)in_stack_fffffffffffff5e0);
  tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            (&tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CTransaction **)&tx_child_3,(allocator<CTransaction> *)&submit2,
             (CMutableTransaction *)&submit1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             &submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2
            );
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&submit1);
  if (0x1c < local_274) {
    free(local_290.indirect_contents.indirect);
    local_290.indirect_contents.indirect = (char *)0x0;
  }
  if (local_700._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_700,
               local_700._M_head_impl);
  }
  local_700._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  if (local_6f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6f0);
  }
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_710 = "";
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar55 = 0x6aa905;
  file_08.m_end = (iterator)0x403;
  file_08.m_begin = (iterator)&local_718;
  msg_08.m_end = pvVar33;
  msg_08.m_begin = pvVar35;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_728,
             msg_08);
  auVar1 = *(undefined1 (*) [16])
            (((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  auVar43[0] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
  auVar43[1] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
  auVar43[2] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
  auVar43[3] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
  auVar43[4] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
  auVar43[5] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
  auVar43[6] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
  auVar43[7] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
  auVar43[8] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
  auVar43[9] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
  auVar43[10] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                 ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
  auVar43[0xb] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                  ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
  auVar43[0xc] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                  ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
  auVar43[0xd] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                  ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
  auVar43[0xe] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                  ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
  auVar43[0xf] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                  ((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
  auVar37[0] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] == auVar1[0])
  ;
  auVar37[1] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] == auVar1[1])
  ;
  auVar37[2] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] == auVar1[2])
  ;
  auVar37[3] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] == auVar1[3])
  ;
  auVar37[4] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] == auVar1[4])
  ;
  auVar37[5] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] == auVar1[5])
  ;
  auVar37[6] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] == auVar1[6])
  ;
  auVar37[7] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] == auVar1[7])
  ;
  auVar37[8] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] == auVar1[8])
  ;
  auVar37[9] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] == auVar1[9])
  ;
  auVar37[10] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 auVar1[10]);
  auVar37[0xb] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  auVar1[0xb]);
  auVar37[0xc] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  auVar1[0xc]);
  auVar37[0xd] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  auVar1[0xd]);
  auVar37[0xe] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  auVar1[0xe]);
  auVar37[0xf] = -(((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  auVar1[0xf]);
  auVar37 = auVar37 & auVar43;
  if ((ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) | (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) == 0xffff) {
    bVar24 = false;
  }
  else {
    auVar1 = *(undefined1 (*) [16])
              (((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    auVar44[0] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                  ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
    auVar44[1] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                  ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
    auVar44[2] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                  ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
    auVar44[3] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                  ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
    auVar44[4] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                  ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
    auVar44[5] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                  ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
    auVar44[6] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                  ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
    auVar44[7] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                  ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
    auVar44[8] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                  ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
    auVar44[9] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                  ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
    auVar44[10] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                   ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
    auVar44[0xb] = -(((tx_parent_3.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                    ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar44[0xc] = -(((tx_parent_3.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                    ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar44[0xd] = -(((tx_parent_3.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                    ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar44[0xe] = -(((tx_parent_3.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                    ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar44[0xf] = -(((tx_parent_3.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                    ((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar38[0] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                  auVar1[0]);
    auVar38[1] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                  auVar1[1]);
    auVar38[2] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                  auVar1[2]);
    auVar38[3] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                  auVar1[3]);
    auVar38[4] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                  auVar1[4]);
    auVar38[5] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                  auVar1[5]);
    auVar38[6] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                  auVar1[6]);
    auVar38[7] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                  auVar1[7]);
    auVar38[8] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                  auVar1[8]);
    auVar38[9] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                  auVar1[9]);
    auVar38[10] = -(((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                   auVar1[10]);
    auVar38[0xb] = -(((tx_parent_3.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] == auVar1[0xb]);
    auVar38[0xc] = -(((tx_parent_3.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] == auVar1[0xc]);
    auVar38[0xd] = -(((tx_parent_3.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] == auVar1[0xd]);
    auVar38[0xe] = -(((tx_parent_3.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] == auVar1[0xe]);
    auVar38[0xf] = -(((tx_parent_3.
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] == auVar1[0xf]);
    auVar38 = auVar38 & auVar44;
    bVar24 = (ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) != 0xffff;
  }
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_mode._0_1_ = bVar24;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)0x0;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       0;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1a0af6d;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xf68094;
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
       _M_p & 0xffffffffffffff00;
  submit1.m_state.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013abc70
  ;
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)&mtx_parent;
  local_738 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_730 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&submit2,(lazy_ostream *)&submit1,1,0,WARN,_cVar55,
             (size_t)&local_738,0x403);
  this_00 = &submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_string_length;
  boost::detail::shared_count::~shared_count((shared_count *)this_00);
  submit1.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       CONCAT71(criticalblock24.super_unique_lock._9_7_,criticalblock24.super_unique_lock._M_owns);
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)criticalblock24.super_unique_lock._M_device;
  if (submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
               field_2._M_allocated_capacity + 8) =
           *(int *)(submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    field_2._M_allocated_capacity + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
               field_2._M_allocated_capacity + 8) =
           *(int *)(submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    field_2._M_allocated_capacity + 8) + 1;
    }
  }
  __l._M_len = 2;
  __l._M_array = (iterator)&submit1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package1,__l,(allocator_type *)&submit2);
  lVar31 = 0x20;
  do {
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&submit2.m_tx_results._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar31
              );
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    lVar31 = lVar31 + -0x10;
  } while (lVar31 != 0);
  submit1.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)
       tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       (size_type)
       tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&submit1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package2,__l_00,(allocator_type *)&submit2);
  lVar31 = 0x20;
  do {
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&submit2.m_tx_results._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar31
              );
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    lVar31 = lVar31 + -0x10;
  } while (lVar31 != 0);
  submit1.m_state.super_ValidationState<PackageValidationResult>._0_8_ =
       tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)
       tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity =
       (size_type)
       tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&submit1;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&package3,__l_01,(allocator_type *)&submit2);
  lVar31 = 0x20;
  do {
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&submit2.m_tx_results._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar31
              );
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    lVar31 = lVar31 + -0x10;
  } while (lVar31 != 0);
  pCVar25 = ChainstateManager::ActiveChainstate
                      ((pTVar51->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup
                       .m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pPVar34 = &submit2;
  auVar11[0xf] = 0;
  auVar11._0_15_ =
       (undefined1  [15])
       submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._1_15_;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._0_16_ =
       auVar11 << 8;
  ProcessNewPackage(&submit1,pCVar25,
                    (pTVar51->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                    m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package1,false,
                    (optional<CFeeRate> *)pPVar34);
  pCVar32 = (pTVar51->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
            mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&submit2,&package1,&submit1,true,pCVar32);
  if (submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_local_buf[8] == '\x01') {
    local_760 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_758 = "";
    local_770 = &boost::unit_test::basic_cstring<char_const>::null;
    local_768 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar55 = 0x6aacd3;
    file_09.m_end = (iterator)0x40e;
    file_09.m_begin = (iterator)&local_760;
    msg_09.m_end = (iterator)pPVar34;
    msg_09.m_begin = (iterator)pCVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_770,
               msg_09);
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._0_1_ = 0;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length._0_1_ = 0;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length._1_7_ = 0;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_1_ = 0;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._17_7_ = 0;
    if (submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_local_buf[8] == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
      goto LAB_006ad61b;
    }
    mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)((ulong)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)&PTR__lazy_ostream_013aba30;
    mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_780 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_778 = "";
    pCVar32 = (CTxMemPool *)0x1;
    pPVar34 = (PackageMempoolAcceptResult *)0x1;
    mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&submit2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&err_2,(lazy_ostream *)&mtx_parent,1,1,WARN,_cVar55,
               (size_t)&local_780,0x40e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&err_2.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x10));
  }
  if ((submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
       _M_local_buf[8] == '\x01') &&
     (submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_local_buf[8] = '\0',
     (size_type *)submit2.m_state.super_ValidationState<PackageValidationResult>._0_8_ != this_00))
  {
    operator_delete((void *)submit2.m_state.super_ValidationState<PackageValidationResult>._0_8_,
                    submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    _M_string_length + 1);
  }
  cVar26 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find(&submit1.m_tx_results._M_t,
                  &((tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped);
  cVar27 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find(&submit1.m_tx_results._M_t,
                  (key_type *)
                  ((long)&criticalblock24.super_unique_lock._M_device[2].
                          super___recursive_mutex_base._M_mutex + 9));
  local_790 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_788 = "";
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x412;
  file_10.m_begin = (iterator)&local_790;
  msg_10.m_end = (iterator)pPVar34;
  msg_10.m_begin = (iterator)pCVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_7a0,
             msg_10);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x30;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13abb;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = 0x21;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = 0xf6cf;
  local_380 = (undefined1  [8])(cVar26._M_node + 2);
  tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((ulong)tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       & 0xffffffff00000000);
  local_3b8._8_8_ = (element_type *)0x0;
  sStack_3a8.pi_ = (sp_counted_base *)0x0;
  local_598._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_598.m_message.px = (element_type *)0xf6592f;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)(submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _1_8_ << 8);
  submit2.m_state.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013b0e70
  ;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_380;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&tx_child_1;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013b0e70;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&tx_parent;
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  local_3b8[0] = cVar26._M_node[2]._M_color == _S_red;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3b8,(lazy_ostream *)&err_2,1,2,REQUIRE,0xf67f6c,
             (size_t)&local_598,0x412,&submit2,"MempoolAcceptResult::ResultType::VALID",
             (int)&mtx_parent);
  boost::detail::shared_count::~shared_count((shared_count *)(local_3b8 + 0x10));
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x413;
  file_11.m_begin = (iterator)&local_7b0;
  msg_11.m_end = pvVar35;
  msg_11.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_7c0,
             msg_11);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x30;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13abb;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = 0x21;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = 0xf6cf;
  local_380 = (undefined1  [8])(cVar27._M_node + 2);
  tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       ((ulong)tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       & 0xffffffff00000000);
  local_3b8[0] = cVar27._M_node[2]._M_color == _S_red;
  local_3b8._8_8_ = (element_type *)0x0;
  sStack_3a8.pi_ = (sp_counted_base *)0x0;
  local_598._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_598.m_message.px = (element_type *)0xf6592f;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)(submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _1_8_ << 8);
  submit2.m_state.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013b0e70
  ;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_380;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&tx_child_1;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013b0e70;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&tx_parent;
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3b8,(lazy_ostream *)&err_2,1,2,REQUIRE,0xf67f8e,
             (size_t)&local_598,0x413,&submit2,"MempoolAcceptResult::ResultType::VALID",
             (int)&mtx_parent);
  boost::detail::shared_count::~shared_count((shared_count *)(local_3b8 + 0x10));
  expected_pool_size = expected_pool_size + 2;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x415;
  file_12.m_begin = (iterator)&local_7d0;
  msg_12.m_end = pvVar35;
  msg_12.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_7e0,
             msg_12);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x30;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13abb;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = 0x21;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = 0xf6cf;
  tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CTxMemPool::size((pTVar51->super_TestingSetup).super_ChainTestingSetup.
                        super_BasicTestingSetup.m_node.mempool._M_t.
                        super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                        super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                        super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  local_3b8[0] = tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr == (element_type *)expected_pool_size;
  local_3b8._8_8_ = (element_type *)0x0;
  sStack_3a8.pi_ = (sp_counted_base *)0x0;
  local_598._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_598.m_message.px = (element_type *)0xf6592f;
  local_380 = (undefined1  [8])&tx_child_1;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)(submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _1_8_ << 8);
  submit2.m_state.super_ValidationState<PackageValidationResult>._0_8_ = &PTR__lazy_ostream_013abb70
  ;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
  _M_allocated_capacity = (size_type)local_380;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&expected_pool_size;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013abb70;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&tx_parent;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3b8,(lazy_ostream *)&err_2,1,2,REQUIRE,0xf66425,
             (size_t)&local_598,0x415,&submit2,"expected_pool_size",(int)&mtx_parent);
  boost::detail::shared_count::~shared_count((shared_count *)(local_3b8 + 0x10));
  pCVar25 = ChainstateManager::ActiveChainstate
                      ((pTVar51->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup
                       .m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  client_maxfeerate = &mtx_parent;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ProcessNewPackage(&submit2,pCVar25,
                    (pTVar51->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                    m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package2,false,
                    (optional<CFeeRate> *)client_maxfeerate);
  pCVar32 = (pTVar51->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
            mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&mtx_parent,&package2,&submit2,true,pCVar32);
  if ((char)mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish == '\x01') {
    local_7f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_7e8 = "";
    local_800 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar55 = 0x6ab2ad;
    file_13.m_end = (iterator)0x41b;
    file_13.m_begin = (iterator)&local_7f0;
    msg_13.m_end = (iterator)client_maxfeerate;
    msg_13.m_begin = (iterator)pCVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_800,
               msg_13);
    local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
    local_3b8._8_8_ = (element_type *)0x0;
    sStack_3a8.pi_ = (sp_counted_base *)0x0;
    if ((char)mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
      goto LAB_006ad61b;
    }
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length._0_1_ = 0;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._0_1_ = 0x30;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._1_7_ = 0x13aba;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_1_ = 0x38;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._17_7_ = 0x13c01;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_1_ = SUB81(&mtx_parent,0);
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._25_7_ = (undefined7)((ulong)&mtx_parent >> 8);
    local_810 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_808 = "";
    pCVar32 = (CTxMemPool *)0x1;
    client_maxfeerate = (CMutableTransaction *)0x1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_3b8,(lazy_ostream *)&err_2,1,1,WARN,_cVar55,
               (size_t)&local_810,0x41b);
    boost::detail::shared_count::~shared_count((shared_count *)(local_3b8 + 0x10));
  }
  if (((char)mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_finish == '\x01') &&
     (mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = '\0',
     mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
     super__Vector_impl_data._M_start !=
     (pointer)&mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage)) {
    operator_delete(mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->prevout).hash.
                            m_wrapped.super_base_blob<256U>.m_data._M_elems + 1));
  }
  cVar26 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find(&submit2.m_tx_results._M_t,
                  &((tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped);
  cVar27 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find(&submit2.m_tx_results._M_t,
                  &((tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->m_witness_hash).m_wrapped);
  local_820 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x41f;
  file_14.m_begin = (iterator)&local_820;
  msg_14.m_end = (iterator)client_maxfeerate;
  msg_14.m_begin = (iterator)pCVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_830,
             msg_14);
  local_3b8._8_8_ = local_3b8._9_8_ << 8;
  local_3b8._0_8_ = &PTR__lazy_ostream_013abb30;
  sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = (undefined1  [8])0xf6cf21;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(cVar26._M_node + 2);
  tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_398;
  local_398._0_4_ = 0;
  local_598.m_message.px = (element_type *)0x0;
  local_598.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_380 = (undefined1  [8])0xf658c7;
  local_378._0_8_ = "";
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013b0e70;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&tx_parent;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13b0e;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = SUB81(&tx_child_1,0);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)&tx_child_1 >> 8);
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  uVar49 = SUB84((lazy_ostream *)&err_2,0);
  local_598.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(cVar26._M_node[2]._M_color == _S_red);
  boost::test_tools::tt_detail::report_assertion
            (&local_598,(lazy_ostream *)local_3b8,1,2,REQUIRE,0xf67faf,(size_t)local_380,0x41f,
             &mtx_parent,"MempoolAcceptResult::ResultType::VALID",uVar49);
  boost::detail::shared_count::~shared_count(&local_598.m_message.pn);
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x420;
  file_15.m_begin = (iterator)&local_840;
  msg_15.m_end = pvVar35;
  msg_15.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_850,
             msg_15);
  local_3b8._8_8_ = local_3b8._9_8_ << 8;
  local_3b8._0_8_ = &PTR__lazy_ostream_013abb30;
  sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = (undefined1  [8])0xf6cf21;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(cVar27._M_node + 2);
  local_398 = (undefined1  [8])((ulong)(uint)local_398._4_4_ << 0x20);
  local_598.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar27._M_node[2]._M_color == _S_red);
  local_598.m_message.px = (element_type *)0x0;
  local_598.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_380 = (undefined1  [8])0xf658c7;
  local_378._0_8_ = "";
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013b0e70;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&tx_parent;
  tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_398;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13b0e;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = SUB81(&tx_child_1,0);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)&tx_child_1 >> 8);
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_598,(lazy_ostream *)local_3b8,1,2,REQUIRE,0xf67fd1,(size_t)local_380,0x420,
             &mtx_parent,"MempoolAcceptResult::ResultType::VALID",uVar49);
  boost::detail::shared_count::~shared_count(&local_598.m_message.pn);
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_858 = "";
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x421;
  file_16.m_begin = (iterator)&local_860;
  msg_16.m_end = pvVar35;
  msg_16.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_870,
             msg_16);
  local_3b8._8_8_ = local_3b8._9_8_ << 8;
  local_3b8._0_8_ = &PTR__lazy_ostream_013abb30;
  sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = (undefined1  [8])0xf6cf21;
  pTVar51 = pTVar52;
  local_398 = (undefined1  [8])
              CTxMemPool::size((pTVar52->super_TestingSetup).super_ChainTestingSetup.
                               super_BasicTestingSetup.m_node.mempool._M_t.
                               super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                               .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  local_598.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_398 == (undefined1  [8])expected_pool_size);
  local_598.m_message.px = (element_type *)0x0;
  local_598.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_380 = (undefined1  [8])0xf658c7;
  local_378._0_8_ = (element_type *)0xf6592f;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_398;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_013abb70;
  mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&tx_parent;
  tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&expected_pool_size;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13abb;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = SUB81(&tx_child_1,0);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)&tx_child_1 >> 8);
  boost::test_tools::tt_detail::report_assertion
            (&local_598,(lazy_ostream *)local_3b8,1,2,REQUIRE,0xf66425,(size_t)local_380,0x421,
             &mtx_parent,"expected_pool_size",uVar49);
  boost::detail::shared_count::~shared_count(&local_598.m_message.pn);
  pCVar25 = ChainstateManager::ActiveChainstate
                      ((pTVar52->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup
                       .m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  poVar36 = &err_2;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  ProcessNewPackage((PackageMempoolAcceptResult *)&mtx_parent,pCVar25,
                    (pTVar52->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                    m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&package3,false,
                    (optional<CFeeRate> *)poVar36);
  pCVar32 = (pTVar52->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
            mempool._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
            super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  CheckPackageMempoolAcceptResult_abi_cxx11_
            (&err_2,&package3,(PackageMempoolAcceptResult *)&mtx_parent,true,pCVar32);
  if (err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_880 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_878 = "";
    local_890 = &boost::unit_test::basic_cstring<char_const>::null;
    local_888 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar55 = 0x6ab860;
    file_17.m_end = (iterator)0x426;
    file_17.m_begin = (iterator)&local_880;
    msg_17.m_end = (iterator)poVar36;
    msg_17.m_begin = (iterator)pCVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_890,
               msg_17);
    local_598._0_8_ = local_598._0_8_ & 0xffffffffffffff00;
    local_598.m_message.px = (element_type *)0x0;
    local_598.m_message.pn.pi_ = (sp_counted_base *)0x0;
    if (err_2.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
      goto LAB_006ad61b;
    }
    local_3b8._8_8_ = local_3b8._9_8_ << 8;
    local_3b8._0_8_ = &PTR__lazy_ostream_013aba30;
    sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_8a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_898 = "";
    pCVar32 = (CTxMemPool *)0x1;
    poVar36 = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x1;
    local_3a0 = (undefined1  [8])&err_2;
    boost::test_tools::tt_detail::report_assertion
              (&local_598,(lazy_ostream *)local_3b8,1,1,WARN,_cVar55,(size_t)&local_8a0,0x426);
    boost::detail::shared_count::~shared_count(&local_598.m_message.pn);
  }
  if (err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    if ((void *)CONCAT71(err_2.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._1_7_,
                         err_2.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload._0_1_) !=
        (void *)((long)&err_2.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 0x10)) {
      operator_delete((void *)CONCAT71(err_2.
                                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ._M_payload._1_7_,
                                       err_2.
                                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ._M_payload._0_1_),
                      CONCAT71(err_2.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload._17_7_,
                               err_2.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload._16_1_) + 1);
    }
  }
  cVar26 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)local_2c0,
                  &((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped);
  cVar27 = std::
           _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           ::find((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)local_2c0,
                  &((tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped);
  local_8b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8a8 = "";
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x42a;
  file_18.m_begin = (iterator)&local_8b0;
  msg_18.m_end = (iterator)poVar36;
  msg_18.m_begin = (iterator)pCVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_8c0,
             msg_18);
  local_598.m_message.px = (element_type *)(local_598.m_message._1_8_ << 8);
  local_598._0_8_ = &PTR__lazy_ostream_013abb30;
  local_598.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_580 = "";
  local_398 = (undefined1  [8])local_3c0;
  local_3c0[0] = '\0';
  local_3c0[1] = '\0';
  local_3c0[2] = '\0';
  local_3c0[3] = '\0';
  tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(cVar26._M_node + 2);
  local_378._0_8_ = (element_type *)0x0;
  local_378._8_8_ = (sp_counted_base *)0x0;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_19fcf61;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf6592f;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13b0e;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = SUB81(&tx_child_1,0);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)&tx_child_1 >> 8);
  local_3b8._8_8_ = local_3b8._9_8_ << 8;
  local_3b8._0_8_ = &PTR__lazy_ostream_013b0e70;
  sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = (undefined1  [8])local_398;
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  local_380[0] = cVar26._M_node[2]._M_color == _S_red;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_380,(lazy_ostream *)&local_598,1,2,REQUIRE,0xf68095,
             (size_t)&tx_parent,0x42a,(pointer)&err_2,"MempoolAcceptResult::ResultType::VALID",
             (int)local_3b8);
  boost::detail::shared_count::~shared_count((shared_count *)(local_380 + 0x10));
  local_8d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8c8 = "";
  local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x42b;
  file_19.m_begin = (iterator)&local_8d0;
  msg_19.m_end = pvVar35;
  msg_19.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_8e0,
             msg_19);
  local_598.m_message.px = (element_type *)(local_598.m_message._1_8_ << 8);
  local_598._0_8_ = &PTR__lazy_ostream_013abb30;
  local_598.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_580 = "";
  local_3c0 = (undefined1  [8])((ulong)(uint)local_3c0._4_4_ << 0x20);
  local_380[0] = cVar27._M_node[2]._M_color == _S_red;
  tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(cVar27._M_node + 2);
  local_378._0_8_ = (element_type *)0x0;
  local_378._8_8_ = (sp_counted_base *)0x0;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_19fcf61;
  tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf6592f;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13b0e;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = SUB81(&tx_child_1,0);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)&tx_child_1 >> 8);
  local_398 = (undefined1  [8])local_3c0;
  local_3b8._8_8_ = local_3b8._9_8_ << 8;
  local_3b8._0_8_ = &PTR__lazy_ostream_013b0e70;
  sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = (undefined1  [8])local_398;
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_380,(lazy_ostream *)&local_598,1,2,REQUIRE,0xf680b7,
             (size_t)&tx_parent,0x42b,(pointer)&err_2,"MempoolAcceptResult::ResultType::VALID",
             (int)local_3b8);
  boost::detail::shared_count::~shared_count((shared_count *)(local_380 + 0x10));
  local_8f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_8e8 = "";
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar55 = 0x6abc32;
  file_20.m_end = (iterator)0x42e;
  file_20.m_begin = (iterator)&local_8f0;
  msg_20.m_end = pvVar35;
  msg_20.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_900,
             msg_20);
  local_3b8._8_8_ = (element_type *)0x0;
  sStack_3a8.pi_ = (sp_counted_base *)0x0;
  local_598._0_8_ = "it_parent_3->second.m_replaced_transactions.size() == 2";
  local_598.m_message.px = (element_type *)0xf6810f;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13abc;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = SUB81((lazy_ostream *)&local_598,0);
  uVar22 = err_2.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._24_1_;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)&local_598 >> 8);
  uVar23 = err_2.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._25_7_;
  local_910 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_908 = "";
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  local_3b8[0] = *(long *)(cVar26._M_node + 5) == 2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3b8,(lazy_ostream *)&err_2,1,0,WARN,_cVar55,
             (size_t)&local_910,0x42e);
  boost::detail::shared_count::~shared_count((shared_count *)(local_3b8 + 0x10));
  local_920 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_918 = "";
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar55 = 0x6abd02;
  file_21.m_end = (iterator)0x42f;
  file_21.m_begin = (iterator)&local_920;
  msg_21.m_end = pvVar35;
  msg_21.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_930,
             msg_21);
  local_3b8[0] = cVar27._M_node[4]._M_left == (_Base_ptr)&cVar27._M_node[4]._M_left;
  local_3b8._8_8_ = (element_type *)0x0;
  sStack_3a8.pi_ = (sp_counted_base *)0x0;
  local_598._0_8_ = "it_child_3->second.m_replaced_transactions.empty()";
  local_598.m_message.px = (element_type *)0xf68142;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13abc;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  local_940 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_938 = "";
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = uVar22;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = uVar23;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3b8,(lazy_ostream *)&err_2,1,0,WARN,_cVar55,
             (size_t)&local_940,0x42f);
  boost::detail::shared_count::~shared_count((shared_count *)(local_3b8 + 0x10));
  uVar50 = *(undefined8 *)
            ((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar8 = *(undefined8 *)
           (((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar9 = *(undefined8 *)
           (((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar10 = *(undefined8 *)
            (((tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = (undefined1)uVar50;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = (undefined7)((ulong)uVar50 >> 8);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = (undefined1)uVar8;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._1_7_ = (undefined7)((ulong)uVar8 >> 8);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = (undefined1)uVar9;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = (undefined7)((ulong)uVar9 >> 8);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = (undefined1)uVar10;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = (undefined7)((ulong)uVar10 >> 8);
  uVar50 = *(undefined8 *)
            ((tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = SUB81(uVar50,0);
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._33_7_ = SUB87((ulong)uVar50 >> 8,0);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&err_2;
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )&tx_parent,__l_02,(allocator_type *)local_3b8);
  iVar28 = GetVirtualTransactionSize
                     (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,0,0);
  iVar53 = (int)iVar28;
  iVar28 = GetVirtualTransactionSize
                     (tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,0,0);
  local_968 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_960 = "";
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar55 = 0x6abe5e;
  file_22.m_end = (iterator)0x433;
  file_22.m_begin = (iterator)&local_968;
  msg_22.m_end = pvVar35;
  msg_22.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_978,
             msg_22);
  if (*(char *)&cVar26._M_node[7]._M_left == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      std::__throw_bad_optional_access();
    }
    goto LAB_006ad61b;
  }
  p_Var5 = cVar26._M_node[6]._M_right;
  p_Var6 = *(_Base_ptr *)(cVar26._M_node + 7);
  if ((long)p_Var6 - (long)p_Var5 ==
      (long)tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi -
      (long)tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    bVar24 = p_Var5 == p_Var6;
    if (!bVar24) {
      auVar45[0] = -(*(undefined1 *)
                      &((tx_parent.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start == (char)p_Var5->_M_color);
      auVar45[1] = -(*(byte *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 1) ==
                    *(byte *)((long)&p_Var5->_M_color + 1));
      auVar45[2] = -(*(byte *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 2) ==
                    *(byte *)((long)&p_Var5->_M_color + 2));
      auVar45[3] = -(*(byte *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 3) ==
                    *(byte *)((long)&p_Var5->_M_color + 3));
      auVar45[4] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 4) == p_Var5->field_0x4);
      auVar45[5] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 5) == p_Var5->field_0x5);
      auVar45[6] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 6) == p_Var5->field_0x6);
      auVar45[7] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 7) == p_Var5->field_0x7);
      auVar45[8] = -(*(char *)&((tx_parent.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish ==
                    *(char *)&p_Var5->_M_parent);
      auVar45[9] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_finish + 1) ==
                    *(char *)((long)&p_Var5->_M_parent + 1));
      auVar45[10] = -(*(char *)((long)&((tx_parent.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->vin).
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_finish + 2) ==
                     *(char *)((long)&p_Var5->_M_parent + 2));
      auVar45[0xb] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vin).
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 3) ==
                      *(char *)((long)&p_Var5->_M_parent + 3));
      auVar45[0xc] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vin).
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 4) ==
                      *(char *)((long)&p_Var5->_M_parent + 4));
      auVar45[0xd] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vin).
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 5) ==
                      *(char *)((long)&p_Var5->_M_parent + 5));
      auVar45[0xe] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vin).
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 6) ==
                      *(char *)((long)&p_Var5->_M_parent + 6));
      auVar45[0xf] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vin).
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 7) ==
                      *(char *)((long)&p_Var5->_M_parent + 7));
      auVar39[0] = -(*(char *)&((tx_parent.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage ==
                    *(char *)&p_Var5->_M_left);
      auVar39[1] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 1) ==
                    *(char *)((long)&p_Var5->_M_left + 1));
      auVar39[2] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 2) ==
                    *(char *)((long)&p_Var5->_M_left + 2));
      auVar39[3] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 3) ==
                    *(char *)((long)&p_Var5->_M_left + 3));
      auVar39[4] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 4) ==
                    *(char *)((long)&p_Var5->_M_left + 4));
      auVar39[5] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 5) ==
                    *(char *)((long)&p_Var5->_M_left + 5));
      auVar39[6] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 6) ==
                    *(char *)((long)&p_Var5->_M_left + 6));
      auVar39[7] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 7) ==
                    *(char *)((long)&p_Var5->_M_left + 7));
      auVar39[8] = -(*(char *)&((tx_parent.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                               _M_impl.super__Vector_impl_data._M_start ==
                    *(char *)&p_Var5->_M_right);
      auVar39[9] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vout).
                                      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                      super__Vector_impl_data._M_start + 1) ==
                    *(char *)((long)&p_Var5->_M_right + 1));
      auVar39[10] = -(*(char *)((long)&((tx_parent.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->vout).
                                       super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                       super__Vector_impl_data._M_start + 2) ==
                     *(char *)((long)&p_Var5->_M_right + 2));
      auVar39[0xb] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_start + 3) ==
                      *(char *)((long)&p_Var5->_M_right + 3));
      auVar39[0xc] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_start + 4) ==
                      *(char *)((long)&p_Var5->_M_right + 4));
      auVar39[0xd] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_start + 5) ==
                      *(char *)((long)&p_Var5->_M_right + 5));
      auVar39[0xe] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_start + 6) ==
                      *(char *)((long)&p_Var5->_M_right + 6));
      auVar39[0xf] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_start + 7) ==
                      *(char *)((long)&p_Var5->_M_right + 7));
      auVar39 = auVar39 & auVar45;
      uVar7 = (ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar39[0xf] >> 7) << 0xf;
      peVar21 = tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      while (uVar7 == 0xffff) {
        ppCVar30 = &(peVar21->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        p_Var29 = p_Var5 + 1;
        bVar24 = p_Var29 == p_Var6;
        if (bVar24) goto LAB_006abf10;
        auVar46[0] = -(*(undefined1 *)ppCVar30 == (char)p_Var29->_M_color);
        auVar46[1] = -(*(byte *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 1) ==
                      *(byte *)((long)&p_Var5[1]._M_color + 1));
        auVar46[2] = -(*(byte *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 2) ==
                      *(byte *)((long)&p_Var5[1]._M_color + 2));
        auVar46[3] = -(*(byte *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 3) ==
                      *(byte *)((long)&p_Var5[1]._M_color + 3));
        auVar46[4] = -(*(char *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 4) ==
                      p_Var5[1].field_0x4);
        auVar46[5] = -(*(char *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 5) ==
                      p_Var5[1].field_0x5);
        auVar46[6] = -(*(char *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 6) ==
                      p_Var5[1].field_0x6);
        auVar46[7] = -(*(char *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 7) ==
                      p_Var5[1].field_0x7);
        auVar46[8] = -(*(char *)&(peVar21->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage ==
                      *(char *)&p_Var5[1]._M_parent);
        auVar46[9] = -(*(char *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage + 1) ==
                      *(char *)((long)&p_Var5[1]._M_parent + 1));
        auVar46[10] = -(*(char *)((long)&(peVar21->vout).
                                         super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage + 2) ==
                       *(char *)((long)&p_Var5[1]._M_parent + 2));
        auVar46[0xb] = -(*(char *)((long)&(peVar21->vout).
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 3) ==
                        *(char *)((long)&p_Var5[1]._M_parent + 3));
        auVar46[0xc] = -(*(char *)((long)&(peVar21->vout).
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 4) ==
                        *(char *)((long)&p_Var5[1]._M_parent + 4));
        auVar46[0xd] = -(*(char *)((long)&(peVar21->vout).
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 5) ==
                        *(char *)((long)&p_Var5[1]._M_parent + 5));
        auVar46[0xe] = -(*(char *)((long)&(peVar21->vout).
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 6) ==
                        *(char *)((long)&p_Var5[1]._M_parent + 6));
        auVar46[0xf] = -(*(char *)((long)&(peVar21->vout).
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 7) ==
                        *(char *)((long)&p_Var5[1]._M_parent + 7));
        auVar40[0] = -((char)peVar21->version == *(char *)&p_Var5[1]._M_left);
        auVar40[1] = -(*(char *)((long)&peVar21->version + 1) ==
                      *(char *)((long)&p_Var5[1]._M_left + 1));
        auVar40[2] = -(*(char *)((long)&peVar21->version + 2) ==
                      *(char *)((long)&p_Var5[1]._M_left + 2));
        auVar40[3] = -(*(char *)((long)&peVar21->version + 3) ==
                      *(char *)((long)&p_Var5[1]._M_left + 3));
        auVar40[4] = -((char)peVar21->nLockTime == *(char *)((long)&p_Var5[1]._M_left + 4));
        auVar40[5] = -(*(char *)((long)&peVar21->nLockTime + 1) ==
                      *(char *)((long)&p_Var5[1]._M_left + 5));
        auVar40[6] = -(*(char *)((long)&peVar21->nLockTime + 2) ==
                      *(char *)((long)&p_Var5[1]._M_left + 6));
        auVar40[7] = -(*(char *)((long)&peVar21->nLockTime + 3) ==
                      *(char *)((long)&p_Var5[1]._M_left + 7));
        auVar40[8] = -(peVar21->m_has_witness == (bool)*(char *)&p_Var5[1]._M_right);
        auVar40[9] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                      *(uchar *)((long)&p_Var5[1]._M_right + 1));
        auVar40[10] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                       *(uchar *)((long)&p_Var5[1]._M_right + 2));
        auVar40[0xb] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                        *(uchar *)((long)&p_Var5[1]._M_right + 3));
        auVar40[0xc] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                        *(uchar *)((long)&p_Var5[1]._M_right + 4));
        auVar40[0xd] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                        *(uchar *)((long)&p_Var5[1]._M_right + 5));
        auVar40[0xe] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                        *(uchar *)((long)&p_Var5[1]._M_right + 6));
        auVar40[0xf] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                        *(uchar *)((long)&p_Var5[1]._M_right + 7));
        auVar40 = auVar40 & auVar46;
        p_Var5 = p_Var29;
        peVar21 = (element_type *)ppCVar30;
        uVar7 = (ushort)(SUB161(auVar40 >> 7,0) & 1) | (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar40[0xf] >> 7) << 0xf;
      }
      goto LAB_006abf0e;
    }
  }
  else {
LAB_006abf0e:
    bVar24 = false;
  }
LAB_006abf10:
  local_3b8[0] = bVar24;
  local_3b8._8_8_ = (element_type *)0x0;
  sStack_3a8.pi_ = (sp_counted_base *)0x0;
  local_598._0_8_ =
       "it_parent_3->second.m_wtxids_fee_calculations.value() == expected_package3_wtxids";
  local_598.m_message.px = (element_type *)0xf68194;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13abc;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  local_988 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_980 = "";
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = uVar22;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = uVar23;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3b8,(lazy_ostream *)&err_2,1,0,WARN,_cVar55,
             (size_t)&local_988,0x433);
  boost::detail::shared_count::~shared_count((shared_count *)(local_3b8 + 0x10));
  local_998 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_990 = "";
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar55 = 0x6abfdf;
  file_23.m_end = (iterator)0x434;
  file_23.m_begin = (iterator)&local_998;
  msg_23.m_end = pvVar35;
  msg_23.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_9a8,
             msg_23);
  if (*(char *)&cVar27._M_node[7]._M_left == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      std::__throw_bad_optional_access();
    }
    goto LAB_006ad61b;
  }
  p_Var5 = cVar27._M_node[6]._M_right;
  p_Var6 = *(_Base_ptr *)(cVar27._M_node + 7);
  if ((long)p_Var6 - (long)p_Var5 ==
      (long)tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi -
      (long)tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    bVar24 = p_Var5 == p_Var6;
    if (!bVar24) {
      auVar47[0] = -(*(undefined1 *)
                      &((tx_parent.
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_start == (char)p_Var5->_M_color);
      auVar47[1] = -(*(byte *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 1) ==
                    *(byte *)((long)&p_Var5->_M_color + 1));
      auVar47[2] = -(*(byte *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 2) ==
                    *(byte *)((long)&p_Var5->_M_color + 2));
      auVar47[3] = -(*(byte *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 3) ==
                    *(byte *)((long)&p_Var5->_M_color + 3));
      auVar47[4] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 4) == p_Var5->field_0x4);
      auVar47[5] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 5) == p_Var5->field_0x5);
      auVar47[6] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 6) == p_Var5->field_0x6);
      auVar47[7] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_start + 7) == p_Var5->field_0x7);
      auVar47[8] = -(*(char *)&((tx_parent.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_finish ==
                    *(char *)&p_Var5->_M_parent);
      auVar47[9] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_finish + 1) ==
                    *(char *)((long)&p_Var5->_M_parent + 1));
      auVar47[10] = -(*(char *)((long)&((tx_parent.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->vin).
                                       super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                       super__Vector_impl_data._M_finish + 2) ==
                     *(char *)((long)&p_Var5->_M_parent + 2));
      auVar47[0xb] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vin).
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 3) ==
                      *(char *)((long)&p_Var5->_M_parent + 3));
      auVar47[0xc] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vin).
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 4) ==
                      *(char *)((long)&p_Var5->_M_parent + 4));
      auVar47[0xd] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vin).
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 5) ==
                      *(char *)((long)&p_Var5->_M_parent + 5));
      auVar47[0xe] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vin).
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 6) ==
                      *(char *)((long)&p_Var5->_M_parent + 6));
      auVar47[0xf] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vin).
                                        super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 7) ==
                      *(char *)((long)&p_Var5->_M_parent + 7));
      auVar41[0] = -(*(char *)&((tx_parent.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage ==
                    *(char *)&p_Var5->_M_left);
      auVar41[1] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 1) ==
                    *(char *)((long)&p_Var5->_M_left + 1));
      auVar41[2] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 2) ==
                    *(char *)((long)&p_Var5->_M_left + 2));
      auVar41[3] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 3) ==
                    *(char *)((long)&p_Var5->_M_left + 3));
      auVar41[4] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 4) ==
                    *(char *)((long)&p_Var5->_M_left + 4));
      auVar41[5] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 5) ==
                    *(char *)((long)&p_Var5->_M_left + 5));
      auVar41[6] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 6) ==
                    *(char *)((long)&p_Var5->_M_left + 6));
      auVar41[7] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vin).
                                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage + 7) ==
                    *(char *)((long)&p_Var5->_M_left + 7));
      auVar41[8] = -(*(char *)&((tx_parent.
                                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                               _M_impl.super__Vector_impl_data._M_start ==
                    *(char *)&p_Var5->_M_right);
      auVar41[9] = -(*(char *)((long)&((tx_parent.
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->vout).
                                      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                      super__Vector_impl_data._M_start + 1) ==
                    *(char *)((long)&p_Var5->_M_right + 1));
      auVar41[10] = -(*(char *)((long)&((tx_parent.
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->vout).
                                       super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                       super__Vector_impl_data._M_start + 2) ==
                     *(char *)((long)&p_Var5->_M_right + 2));
      auVar41[0xb] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_start + 3) ==
                      *(char *)((long)&p_Var5->_M_right + 3));
      auVar41[0xc] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_start + 4) ==
                      *(char *)((long)&p_Var5->_M_right + 4));
      auVar41[0xd] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_start + 5) ==
                      *(char *)((long)&p_Var5->_M_right + 5));
      auVar41[0xe] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_start + 6) ==
                      *(char *)((long)&p_Var5->_M_right + 6));
      auVar41[0xf] = -(*(char *)((long)&((tx_parent.
                                          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_start + 7) ==
                      *(char *)((long)&p_Var5->_M_right + 7));
      auVar41 = auVar41 & auVar47;
      uVar7 = (ushort)(SUB161(auVar41 >> 7,0) & 1) | (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar41[0xf] >> 7) << 0xf;
      peVar21 = tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      while (uVar7 == 0xffff) {
        ppCVar30 = &(peVar21->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        p_Var29 = p_Var5 + 1;
        bVar24 = p_Var29 == p_Var6;
        if (bVar24) goto LAB_006ac093;
        auVar48[0] = -(*(undefined1 *)ppCVar30 == (char)p_Var29->_M_color);
        auVar48[1] = -(*(byte *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 1) ==
                      *(byte *)((long)&p_Var5[1]._M_color + 1));
        auVar48[2] = -(*(byte *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 2) ==
                      *(byte *)((long)&p_Var5[1]._M_color + 2));
        auVar48[3] = -(*(byte *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 3) ==
                      *(byte *)((long)&p_Var5[1]._M_color + 3));
        auVar48[4] = -(*(char *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 4) ==
                      p_Var5[1].field_0x4);
        auVar48[5] = -(*(char *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 5) ==
                      p_Var5[1].field_0x5);
        auVar48[6] = -(*(char *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 6) ==
                      p_Var5[1].field_0x6);
        auVar48[7] = -(*(char *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_finish + 7) ==
                      p_Var5[1].field_0x7);
        auVar48[8] = -(*(char *)&(peVar21->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage ==
                      *(char *)&p_Var5[1]._M_parent);
        auVar48[9] = -(*(char *)((long)&(peVar21->vout).
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage + 1) ==
                      *(char *)((long)&p_Var5[1]._M_parent + 1));
        auVar48[10] = -(*(char *)((long)&(peVar21->vout).
                                         super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage + 2) ==
                       *(char *)((long)&p_Var5[1]._M_parent + 2));
        auVar48[0xb] = -(*(char *)((long)&(peVar21->vout).
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 3) ==
                        *(char *)((long)&p_Var5[1]._M_parent + 3));
        auVar48[0xc] = -(*(char *)((long)&(peVar21->vout).
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 4) ==
                        *(char *)((long)&p_Var5[1]._M_parent + 4));
        auVar48[0xd] = -(*(char *)((long)&(peVar21->vout).
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 5) ==
                        *(char *)((long)&p_Var5[1]._M_parent + 5));
        auVar48[0xe] = -(*(char *)((long)&(peVar21->vout).
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 6) ==
                        *(char *)((long)&p_Var5[1]._M_parent + 6));
        auVar48[0xf] = -(*(char *)((long)&(peVar21->vout).
                                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage + 7) ==
                        *(char *)((long)&p_Var5[1]._M_parent + 7));
        auVar42[0] = -((char)peVar21->version == *(char *)&p_Var5[1]._M_left);
        auVar42[1] = -(*(char *)((long)&peVar21->version + 1) ==
                      *(char *)((long)&p_Var5[1]._M_left + 1));
        auVar42[2] = -(*(char *)((long)&peVar21->version + 2) ==
                      *(char *)((long)&p_Var5[1]._M_left + 2));
        auVar42[3] = -(*(char *)((long)&peVar21->version + 3) ==
                      *(char *)((long)&p_Var5[1]._M_left + 3));
        auVar42[4] = -((char)peVar21->nLockTime == *(char *)((long)&p_Var5[1]._M_left + 4));
        auVar42[5] = -(*(char *)((long)&peVar21->nLockTime + 1) ==
                      *(char *)((long)&p_Var5[1]._M_left + 5));
        auVar42[6] = -(*(char *)((long)&peVar21->nLockTime + 2) ==
                      *(char *)((long)&p_Var5[1]._M_left + 6));
        auVar42[7] = -(*(char *)((long)&peVar21->nLockTime + 3) ==
                      *(char *)((long)&p_Var5[1]._M_left + 7));
        auVar42[8] = -(peVar21->m_has_witness == (bool)*(char *)&p_Var5[1]._M_right);
        auVar42[9] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                      *(uchar *)((long)&p_Var5[1]._M_right + 1));
        auVar42[10] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                       *(uchar *)((long)&p_Var5[1]._M_right + 2));
        auVar42[0xb] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                        *(uchar *)((long)&p_Var5[1]._M_right + 3));
        auVar42[0xc] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                        *(uchar *)((long)&p_Var5[1]._M_right + 4));
        auVar42[0xd] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                        *(uchar *)((long)&p_Var5[1]._M_right + 5));
        auVar42[0xe] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                        *(uchar *)((long)&p_Var5[1]._M_right + 6));
        auVar42[0xf] = -((peVar21->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                        *(uchar *)((long)&p_Var5[1]._M_right + 7));
        auVar42 = auVar42 & auVar48;
        p_Var5 = p_Var29;
        peVar21 = (element_type *)ppCVar30;
        uVar7 = (ushort)(SUB161(auVar42 >> 7,0) & 1) | (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar42[0xf] >> 7) << 0xf;
      }
      goto LAB_006ac091;
    }
  }
  else {
LAB_006ac091:
    bVar24 = false;
  }
LAB_006ac093:
  local_3b8[0] = bVar24;
  local_3b8._8_8_ = (element_type *)0x0;
  sStack_3a8.pi_ = (sp_counted_base *)0x0;
  local_598._0_8_ =
       "it_child_3->second.m_wtxids_fee_calculations.value() == expected_package3_wtxids";
  local_598.m_message.px = (element_type *)0xf681e5;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length._0_1_ = 0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._0_1_ = 0x70;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._1_7_ = 0x13abc;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_1_ = 0x38;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._17_7_ = 0x13c01;
  local_9b8[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_9b8[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
                         + 0x68);
  pvVar33 = (iterator)0x1;
  pvVar35 = (iterator)0x0;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = uVar22;
  err_2.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._25_7_ = uVar23;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_3b8,(lazy_ostream *)&err_2,1,0,WARN,_cVar55,(size_t)local_9b8
             ,0x434);
  boost::detail::shared_count::~shared_count((shared_count *)(local_3b8 + 0x10));
  local_9c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
  ;
  local_9c0 = "";
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x435;
  file_24.m_begin = (iterator)&local_9c8;
  msg_24.m_end = pvVar35;
  msg_24.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_9d8,
             msg_24);
  local_598.m_message.px = (element_type *)(local_598.m_message._1_8_ << 8);
  local_598._0_8_ = &PTR__lazy_ostream_013abb30;
  local_598.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_580 = "";
  if (*(char *)&cVar26._M_node[6]._M_left == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    num_bytes = (int)iVar28 + iVar53;
    local_9e4._4_8_ = CFeeRate::GetFee((CFeeRate *)&cVar26._M_node[6]._M_parent,num_bytes);
    local_398 = (undefined1  [8])(local_9e4 + 4);
    local_380[0] = local_9e4._4_8_ == 0x5db;
    local_9e4[0] = 0xdb;
    local_9e4[1] = '\x05';
    local_9e4[2] = '\0';
    local_9e4[3] = '\0';
    local_378._0_8_ = (element_type *)0x0;
    local_378._8_8_ = (sp_counted_base *)0x0;
    tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)anon_var_dwarf_19fcf61;
    tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf6592f;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length._0_1_ = 0;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._0_1_ = 0xd0;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._1_7_ = 0x13abe;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._16_1_ = 0x38;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._17_7_ = 0x13c01;
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_1_ = SUB81(local_398,0);
    err_2.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._25_7_ = (undefined7)((ulong)local_398 >> 8);
    local_3b8._8_8_ = local_3b8._9_8_ << 8;
    local_3b8._0_8_ = &PTR__lazy_ostream_013abcf0;
    sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_3a0 = (undefined1  [8])local_3c0;
    pvVar33 = (iterator)0x1;
    pvVar35 = (iterator)0x2;
    local_3c0 = (undefined1  [8])local_9e4;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_380,(lazy_ostream *)&local_598,1,2,REQUIRE,0xf681e6,
               (size_t)&tx_child_1,0x435,&err_2,"199 + 1300",(int)local_3b8);
    boost::detail::shared_count::~shared_count((shared_count *)(local_380 + 0x10));
    local_9f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
    ;
    local_9f0 = "";
    local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
    file_25.m_end = (iterator)0x436;
    file_25.m_begin = (iterator)&local_9f8;
    msg_25.m_end = pvVar35;
    msg_25.m_begin = pvVar33;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_a08,
               msg_25);
    local_598.m_message.px = (element_type *)(local_598.m_message._1_8_ << 8);
    local_598._0_8_ = &PTR__lazy_ostream_013abb30;
    local_598.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_580 = "";
    if (*(char *)&cVar27._M_node[6]._M_left == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      local_9e4._4_8_ = CFeeRate::GetFee((CFeeRate *)&cVar27._M_node[6]._M_parent,num_bytes);
      local_9e4[0] = 0xdb;
      local_9e4[1] = '\x05';
      local_9e4[2] = '\0';
      local_9e4[3] = '\0';
      local_378._0_8_ = (element_type *)0x0;
      local_378._8_8_ = (sp_counted_base *)0x0;
      tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)anon_var_dwarf_19fcf61;
      tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf6592f;
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length._0_1_ = 0;
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._0_1_ = 0xd0;
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._1_7_ = 0x13abe;
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._16_1_ = 0x38;
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._17_7_ = 0x13c01;
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ = SUB81(local_398,0);
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._25_7_ = (undefined7)((ulong)local_398 >> 8);
      local_3b8._8_8_ = local_3b8._9_8_ << 8;
      local_3b8._0_8_ = &PTR__lazy_ostream_013abcf0;
      sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_3a0 = (undefined1  [8])local_3c0;
      pvVar33 = (iterator)0x1;
      pvVar35 = (iterator)0x2;
      local_3c0 = (undefined1  [8])local_9e4;
      local_398 = (undefined1  [8])(local_9e4 + 4);
      local_380[0] = local_9e4._4_8_ == 0x5db;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_380,(lazy_ostream *)&local_598,1,2,REQUIRE,0xf6823e,
                 (size_t)&tx_child_1,0x436,&err_2,"199 + 1300",(int)local_3b8);
      boost::detail::shared_count::~shared_count((shared_count *)(local_380 + 0x10));
      local_a18 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txpackage_tests.cpp"
      ;
      local_a10 = "";
      file_26.m_end = (iterator)0x438;
      file_26.m_begin = (iterator)&local_a18;
      msg_26.m_end = pvVar35;
      msg_26.m_begin = pvVar33;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,
                 (size_t)&stack0xfffffffffffff5d8,msg_26);
      local_598.m_message.px = (element_type *)(local_598.m_message._1_8_ << 8);
      local_598._0_8_ = &PTR__lazy_ostream_013abb30;
      local_598.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_580 = "";
      local_9e4._4_8_ =
           CTxMemPool::size((pTVar51->super_TestingSetup).super_ChainTestingSetup.
                            super_BasicTestingSetup.m_node.mempool._M_t.
                            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
                            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
      local_380[0] = local_9e4._4_8_ == expected_pool_size;
      local_378._0_8_ = (element_type *)0x0;
      local_378._8_8_ = (sp_counted_base *)0x0;
      tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)anon_var_dwarf_19fcf61;
      tx_child_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf6592f;
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length._0_1_ = 0;
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._0_1_ = 0x70;
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._1_7_ = 0x13abb;
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._16_1_ = 0x38;
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._17_7_ = 0x13c01;
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ = SUB81(local_398,0);
      err_2.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._25_7_ = (undefined7)((ulong)local_398 >> 8);
      local_3c0 = (undefined1  [8])&expected_pool_size;
      local_3b8._8_8_ = local_3b8._9_8_ << 8;
      local_3b8._0_8_ = &PTR__lazy_ostream_013abb70;
      sStack_3a8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_3a0 = (undefined1  [8])local_3c0;
      local_398 = (undefined1  [8])(local_9e4 + 4);
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_380,(lazy_ostream *)&local_598,1,2,REQUIRE,0xf66425,
                 (size_t)&tx_child_1,0x438,&err_2,"expected_pool_size",(int)local_3b8);
      boost::detail::shared_count::~shared_count((shared_count *)(local_380 + 0x10));
      if (tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        operator_delete(tx_parent.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,local_948 -
                                (long)tx_parent.
                                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
      }
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)local_2c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage != &local_2d0) {
        operator_delete(mtx_parent.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        local_2d0._M_allocated_capacity + 1);
      }
      if (mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)&mtx_parent.vout) {
        operator_delete(mtx_parent.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish,
                        (ulong)((long)&(mtx_parent.vout.
                                        super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                        super__Vector_impl_data._M_start)->nValue + 1));
      }
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~_Rb_tree(&submit2.m_tx_results._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)submit2.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
             _M_dataplus._M_p !=
          &submit2.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2) {
        operator_delete(submit2.m_state.super_ValidationState<PackageValidationResult>.
                        m_debug_message._M_dataplus._M_p,
                        submit2.m_state.super_ValidationState<PackageValidationResult>.
                        m_debug_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_dataplus._M_p !=
          &submit2.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2) {
        operator_delete(submit2.m_state.super_ValidationState<PackageValidationResult>.
                        m_reject_reason._M_dataplus._M_p,
                        submit2.m_state.super_ValidationState<PackageValidationResult>.
                        m_reject_reason.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~_Rb_tree(&submit1.m_tx_results._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)submit1.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.
             _M_dataplus._M_p !=
          &submit1.m_state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2) {
        operator_delete(submit1.m_state.super_ValidationState<PackageValidationResult>.
                        m_debug_message._M_dataplus._M_p,
                        submit1.m_state.super_ValidationState<PackageValidationResult>.
                        m_debug_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
             _M_dataplus._M_p !=
          &submit1.m_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2) {
        operator_delete(submit1.m_state.super_ValidationState<PackageValidationResult>.
                        m_reject_reason._M_dataplus._M_p,
                        submit1.m_state.super_ValidationState<PackageValidationResult>.
                        m_reject_reason.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&package3);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&package2);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&package1);
      if (tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx_child_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx_parent_3.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx_child_2_1.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx_parent_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT71(criticalblock24.super_unique_lock._9_7_,criticalblock24.super_unique_lock._M_owns
                  ) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(criticalblock24.super_unique_lock._9_7_,
                            criticalblock24.super_unique_lock._M_owns));
      }
      if (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tx_child_2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (0x1c < child_spk.super_CScriptBase._size) {
        free(child_spk.super_CScriptBase._union.indirect_contents.indirect);
        child_spk.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
      }
      if ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           )grandchild_key.keydata._M_t.
            super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           )0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&grandchild_key.keydata,
                   (array<unsigned_char,_32UL> *)
                   grandchild_key.keydata._M_t.
                   super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
      }
      if (0x1c < parent_spk.super_CScriptBase._size) {
        free(parent_spk.super_CScriptBase._union.indirect_contents.indirect);
        parent_spk.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
      }
      if ((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           )child_key.keydata._M_t.
            super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
           )0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&child_key.keydata,
                   (array<unsigned_char,_32UL> *)
                   child_key.keydata._M_t.
                   super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock23.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
    }
  }
LAB_006ad61b:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(package_rbf_tests)
{
    mineBlocks(5);
    LOCK(::cs_main);
    size_t expected_pool_size = m_node.mempool->size();
    CKey child_key{GenerateRandomKey()};
    CScript parent_spk = GetScriptForDestination(WitnessV0KeyHash(child_key.GetPubKey()));
    CKey grandchild_key{GenerateRandomKey()};
    CScript child_spk = GetScriptForDestination(WitnessV0KeyHash(grandchild_key.GetPubKey()));

    const CAmount coinbase_value{50 * COIN};
    // Test that de-duplication works. This is not actually package rbf.
    {
        // 1 parent paying 200sat, 1 child paying 300sat
        Package package1;
        // 1 parent paying 200sat, 1 child paying 500sat
        Package package2;
        // Package1 and package2 have the same parent. The children conflict.
        auto mtx_parent = CreateValidMempoolTransaction(/*input_transaction=*/m_coinbase_txns[0], /*input_vout=*/0,
                                                        /*input_height=*/0, /*input_signing_key=*/coinbaseKey,
                                                        /*output_destination=*/parent_spk,
                                                        /*output_amount=*/coinbase_value - low_fee_amt, /*submit=*/false);
        CTransactionRef tx_parent = MakeTransactionRef(mtx_parent);
        package1.push_back(tx_parent);
        package2.push_back(tx_parent);

        CTransactionRef tx_child_1 = MakeTransactionRef(CreateValidMempoolTransaction(tx_parent, 0, 101, child_key, child_spk, coinbase_value - low_fee_amt - 300, false));
        package1.push_back(tx_child_1);
        CTransactionRef tx_child_2 = MakeTransactionRef(CreateValidMempoolTransaction(tx_parent, 0, 101, child_key, child_spk, coinbase_value - low_fee_amt - 500, false));
        package2.push_back(tx_child_2);

        LOCK(m_node.mempool->cs);
        const auto submit1 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package1, /*test_accept=*/false, std::nullopt);
        if (auto err_1{CheckPackageMempoolAcceptResult(package1, submit1, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_1.value());
        }

        // Check precise ResultTypes and mempool size. We know it_parent_1 and it_child_1 exist from above call
        auto it_parent_1 = submit1.m_tx_results.find(tx_parent->GetWitnessHash());
        auto it_child_1 = submit1.m_tx_results.find(tx_child_1->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_parent_1->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        BOOST_CHECK_EQUAL(it_child_1->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        expected_pool_size += 2;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

        const auto submit2 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package2, /*test_accept=*/false, std::nullopt);
        if (auto err_2{CheckPackageMempoolAcceptResult(package2, submit2, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_2.value());
        }

        // Check precise ResultTypes and mempool size. We know it_parent_2 and it_child_2 exist from above call
        auto it_parent_2 = submit2.m_tx_results.find(tx_parent->GetWitnessHash());
        auto it_child_2 = submit2.m_tx_results.find(tx_child_2->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_parent_2->second.m_result_type, MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
        BOOST_CHECK_EQUAL(it_child_2->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

        // child1 has been replaced
        BOOST_CHECK(!m_node.mempool->exists(GenTxid::Txid(tx_child_1->GetHash())));
    }

    // Test package rbf.
    {
        CTransactionRef tx_parent_1 = MakeTransactionRef(CreateValidMempoolTransaction(
            m_coinbase_txns[1], /*input_vout=*/0, /*input_height=*/0,
            coinbaseKey, parent_spk, coinbase_value - 200, /*submit=*/false));
        CTransactionRef tx_child_1 = MakeTransactionRef(CreateValidMempoolTransaction(
            tx_parent_1, /*input_vout=*/0, /*input_height=*/101,
            child_key, child_spk, coinbase_value - 400, /*submit=*/false));

        CTransactionRef tx_parent_2 = MakeTransactionRef(CreateValidMempoolTransaction(
            m_coinbase_txns[1], /*input_vout=*/0, /*input_height=*/0,
            coinbaseKey, parent_spk, coinbase_value - 800, /*submit=*/false));
        CTransactionRef tx_child_2 = MakeTransactionRef(CreateValidMempoolTransaction(
            tx_parent_2, /*input_vout=*/0, /*input_height=*/101,
            child_key, child_spk, coinbase_value - 800 - 200, /*submit=*/false));

        CTransactionRef tx_parent_3 = MakeTransactionRef(CreateValidMempoolTransaction(
            m_coinbase_txns[1], /*input_vout=*/0, /*input_height=*/0,
            coinbaseKey, parent_spk, coinbase_value - 199, /*submit=*/false));
        CTransactionRef tx_child_3 = MakeTransactionRef(CreateValidMempoolTransaction(
            tx_parent_3, /*input_vout=*/0, /*input_height=*/101,
            child_key, child_spk, coinbase_value - 199 - 1300, /*submit=*/false));

        // In all packages, the parents conflict with each other
        BOOST_CHECK(tx_parent_1->GetHash() != tx_parent_2->GetHash() && tx_parent_2->GetHash() != tx_parent_3->GetHash());

        // 1 parent paying 200sat, 1 child paying 200sat.
        Package package1{tx_parent_1, tx_child_1};
        // 1 parent paying 800sat, 1 child paying 200sat.
        Package package2{tx_parent_2, tx_child_2};
        // 1 parent paying 199sat, 1 child paying 1300sat.
        Package package3{tx_parent_3, tx_child_3};

        const auto submit1 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package1, false, std::nullopt);
        if (auto err_1{CheckPackageMempoolAcceptResult(package1, submit1, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_1.value());
        }
        auto it_parent_1 = submit1.m_tx_results.find(tx_parent_1->GetWitnessHash());
        auto it_child_1 = submit1.m_tx_results.find(tx_child_1->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_parent_1->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        BOOST_CHECK_EQUAL(it_child_1->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        expected_pool_size += 2;
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

        // This replacement is actually not package rbf; the parent carries enough fees
        // to replace the entire package on its own.
        const auto submit2 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package2, false, std::nullopt);
        if (auto err_2{CheckPackageMempoolAcceptResult(package2, submit2, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_2.value());
        }
        auto it_parent_2 = submit2.m_tx_results.find(tx_parent_2->GetWitnessHash());
        auto it_child_2 = submit2.m_tx_results.find(tx_child_2->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_parent_2->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        BOOST_CHECK_EQUAL(it_child_2->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);

        // Package RBF, in which the replacement transaction's child sponsors the fees to meet RBF feerate rules
        const auto submit3 = ProcessNewPackage(m_node.chainman->ActiveChainstate(), *m_node.mempool, package3, false, std::nullopt);
        if (auto err_3{CheckPackageMempoolAcceptResult(package3, submit3, /*expect_valid=*/true, m_node.mempool.get())}) {
            BOOST_ERROR(err_3.value());
        }
        auto it_parent_3 = submit3.m_tx_results.find(tx_parent_3->GetWitnessHash());
        auto it_child_3 = submit3.m_tx_results.find(tx_child_3->GetWitnessHash());
        BOOST_CHECK_EQUAL(it_parent_3->second.m_result_type, MempoolAcceptResult::ResultType::VALID);
        BOOST_CHECK_EQUAL(it_child_3->second.m_result_type, MempoolAcceptResult::ResultType::VALID);

        // package3 was considered as a package to replace both package2 transactions
        BOOST_CHECK(it_parent_3->second.m_replaced_transactions.size() == 2);
        BOOST_CHECK(it_child_3->second.m_replaced_transactions.empty());

        std::vector<Wtxid> expected_package3_wtxids({tx_parent_3->GetWitnessHash(), tx_child_3->GetWitnessHash()});
        const auto package3_total_vsize{GetVirtualTransactionSize(*tx_parent_3) + GetVirtualTransactionSize(*tx_child_3)};
        BOOST_CHECK(it_parent_3->second.m_wtxids_fee_calculations.value() == expected_package3_wtxids);
        BOOST_CHECK(it_child_3->second.m_wtxids_fee_calculations.value() == expected_package3_wtxids);
        BOOST_CHECK_EQUAL(it_parent_3->second.m_effective_feerate.value().GetFee(package3_total_vsize), 199 + 1300);
        BOOST_CHECK_EQUAL(it_child_3->second.m_effective_feerate.value().GetFee(package3_total_vsize), 199 + 1300);

        BOOST_CHECK_EQUAL(m_node.mempool->size(), expected_pool_size);
    }

}